

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>
Catch::Detail::make_unique<Catch::ReporterRegistry::ReporterRegistryImpl>(void)

{
  ReporterRegistryImpl *ptr;
  ReporterRegistryImpl *in_RDI;
  ReporterRegistryImpl *this;
  
  this = in_RDI;
  ptr = (ReporterRegistryImpl *)operator_new(0x48);
  memset(ptr,0,0x48);
  ReporterRegistry::ReporterRegistryImpl::ReporterRegistryImpl(this);
  unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::unique_ptr
            ((unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl> *)this,ptr);
  return (unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>)in_RDI;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }